

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflowsol.cpp
# Opt level: O3

void __thiscall
ArcflowSol::ArcflowSol
          (ArcflowSol *this,Instance *_inst,
          map<Arc,_int,_std::less<Arc>,_std::allocator<std::pair<const_Arc,_int>_>_> *_flow,int _S,
          vector<int,_std::allocator<int>_> *_Ts,int _LOSS)

{
  _Rb_tree_header *p_Var1;
  int *piVar2;
  pointer piVar3;
  pointer pvVar4;
  pointer ppVar5;
  pointer piVar6;
  bool bVar7;
  pattern_pair *pat;
  pointer ppVar8;
  _Rb_tree_node_base *p_Var9;
  runtime_error *prVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  map<Arc,_int,_std::less<Arc>,_std::allocator<std::pair<const_Arc,_int>_>_> *__range1;
  vector<int,_std::allocator<int>_> dem;
  char _error_msg_ [256];
  vector<int,_std::allocator<int>_> local_170;
  vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  local_158;
  vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  local_138 [11];
  
  Instance::Instance(&this->inst,_inst);
  std::
  _Rb_tree<Arc,_std::pair<const_Arc,_int>,_std::_Select1st<std::pair<const_Arc,_int>_>,_std::less<Arc>,_std::allocator<std::pair<const_Arc,_int>_>_>
  ::_Rb_tree(&(this->flow)._M_t,&_flow->_M_t);
  this->S = _S;
  std::vector<int,_std::allocator<int>_>::vector(&this->Ts,_Ts);
  this->LOSS = _LOSS;
  (this->nbins).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->nbins).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->nbins).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->sols).
  super__Vector_base<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>,_std::allocator<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sols).
  super__Vector_base<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>,_std::allocator<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sols).
  super__Vector_base<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>,_std::allocator<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_170,(long)(this->inst).m,(allocator_type *)local_138);
  if (0 < (this->inst).m) {
    piVar3 = (this->inst).demands.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar11 = 0;
    do {
      local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar11] = piVar3[lVar11];
      lVar11 = lVar11 + 1;
    } while (lVar11 < (this->inst).m);
  }
  this->objvalue = 0;
  std::
  vector<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>,_std::allocator<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>_>
  ::resize(&this->sols,(long)(this->inst).nbtypes);
  std::vector<int,_std::allocator<int>_>::resize(&this->nbins,(long)(this->inst).nbtypes);
  if (0 < (this->inst).nbtypes) {
    lVar11 = 0;
    do {
      extract_solution(&local_158,this,&local_170,
                       (this->Ts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar11]);
      pvVar4 = (this->sols).
               super__Vector_base<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>,_std::allocator<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_138[0].
      super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           *(pointer *)
            ((long)&pvVar4[lVar11].
                    super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data + 0x10);
      local_138[0].
      super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           pvVar4[lVar11].
           super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_138[0].
      super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           *(pointer *)
            ((long)&pvVar4[lVar11].
                    super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data + 8);
      pvVar4[lVar11].
      super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_158.
           super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      *(pointer *)
       ((long)&pvVar4[lVar11].
               super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data + 8) =
           local_158.
           super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      *(pointer *)
       ((long)&pvVar4[lVar11].
               super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data + 0x10) =
           local_158.
           super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_158.
      super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158.
      super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158.
      super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
      ::~vector(local_138);
      std::
      vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
      ::~vector(&local_158);
      bVar7 = is_valid(this,(this->sols).
                            super__Vector_base<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>,_std::allocator<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar11,(int)lVar11);
      if (!bVar7) {
        snprintf((char *)local_138,0x100,"Error: `%s` in \"%s\" line %d",
                 "Invalid solution! (capacity)",
                 "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflowsol.cpp"
                 ,0x1d);
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar10,(char *)local_138);
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pvVar4 = (this->sols).
               super__Vector_base<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>,_std::allocator<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar8 = pvVar4[lVar11].
               super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar5 = *(pointer *)
                ((long)&pvVar4[lVar11].
                        super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data + 8);
      if (ppVar8 != ppVar5) {
        piVar3 = (this->inst).Cs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar6 = (this->nbins).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          iVar13 = ppVar8->first;
          this->objvalue = this->objvalue + piVar3[lVar11] * iVar13;
          piVar2 = piVar6 + lVar11;
          *piVar2 = *piVar2 + iVar13;
          ppVar8 = ppVar8 + 1;
        } while (ppVar8 != ppVar5);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < (this->inst).nbtypes);
  }
  lVar11 = (long)(this->inst).m;
  if (0 < lVar11) {
    lVar12 = 0;
    do {
      if (0 < local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar12]) {
        snprintf((char *)local_138,0x100,"Error: `%s` in \"%s\" line %d",
                 "Invalid solution! (demand)",
                 "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflowsol.cpp"
                 ,0x28);
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar10,(char *)local_138);
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      lVar12 = lVar12 + 1;
    } while (lVar11 != lVar12);
  }
  p_Var9 = (this->flow)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->flow)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var9 != p_Var1) {
    iVar13 = 0;
    do {
      iVar13 = iVar13 + *(int *)((long)&p_Var9[1]._M_parent + 4);
      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
    } while ((_Rb_tree_header *)p_Var9 != p_Var1);
    if (iVar13 != 0) {
      snprintf((char *)local_138,0x100,"Error: `%s` in \"%s\" line %d","Invalid solution! (flow)",
               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflowsol.cpp"
               ,0x31);
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar10,(char *)local_138);
      __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  if (local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

ArcflowSol::ArcflowSol(const Instance &_inst, const std::map<Arc, int> &_flow,
					   int _S, const std::vector<int> &_Ts, int _LOSS) :
		inst(_inst), flow(_flow), S(_S), Ts(_Ts), LOSS(_LOSS) {
	std::vector<int> dem(inst.m);
	for (int i = 0; i < inst.m; i++) {
		dem[i] = inst.demands[i];
	}

	objvalue = 0;
	sols.resize(inst.nbtypes);
	nbins.resize(inst.nbtypes);
	for (int t = 0; t < inst.nbtypes; t++) {
		sols[t] = extract_solution(&dem, Ts[t]);
		if (!is_valid(sols[t], t)) {
			throw_error("Invalid solution! (capacity)");
		}

		for (const pattern_pair &pat : sols[t]) {
			objvalue += pat.first * inst.Cs[t];
			nbins[t] += pat.first;
		}
	}

	for (int i = 0; i < inst.m; i++) {
		if (dem[i] > 0) {
			throw_error("Invalid solution! (demand)");
		}
	}

	int fs = 0;
	for (const auto &kvpair : flow) {
		fs += kvpair.second;
	}
	if (fs != 0) {
		throw_error("Invalid solution! (flow)");
	}
}